

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O1

void sysbvm_stackFrame_iterateGCRootsInRecordWith
               (sysbvm_stackFrameRecord_t *record,void *userdata,
               sysbvm_GCRootIterationFunction_t *iterationFunction)

{
  long lVar1;
  long lVar2;
  sysbvm_stackFrameRecord_s *psVar3;
  ulong uVar4;
  long lVar5;
  sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t *functionRecord;
  sysbvm_stackFrameRecord_t *psVar6;
  sysbvm_stackFrameRecordType_t *psVar7;
  long lVar8;
  
  lVar1 = 0x10;
  switch(record->type) {
  case SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS:
    if (record[1].previous == (sysbvm_stackFrameRecord_s *)0x0) {
      return;
    }
    lVar1 = 0;
    psVar3 = (sysbvm_stackFrameRecord_s *)0x0;
    do {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)(*(long *)&record[1].type + lVar1));
      psVar3 = (sysbvm_stackFrameRecord_s *)((long)&psVar3->previous + 1);
      lVar1 = lVar1 + 8;
    } while (psVar3 < record[1].previous);
    return;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION:
    lVar8 = 0x20;
    lVar5 = 0x18;
    lVar2 = lVar1;
    lVar1 = 0x28;
    break;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 1));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[1].type);
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 2));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[2].type);
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 3));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[3].type);
    if (record[4].previous != (sysbvm_stackFrameRecord_s *)0x0) {
      lVar1 = 0;
      psVar3 = (sysbvm_stackFrameRecord_s *)0x0;
      do {
        (*iterationFunction)(userdata,(sysbvm_tuple_t *)(*(long *)&record[4].type + lVar1));
        psVar3 = (sysbvm_stackFrameRecord_s *)((long)&psVar3->previous + 1);
        lVar1 = lVar1 + 8;
      } while (psVar3 < record[4].previous);
    }
    if (record[5].previous != (sysbvm_stackFrameRecord_s *)0x0) {
      lVar1 = 0;
      psVar3 = (sysbvm_stackFrameRecord_s *)0x0;
      do {
        (*iterationFunction)(userdata,(sysbvm_tuple_t *)(*(long *)&record[5].type + lVar1));
        psVar3 = (sysbvm_stackFrameRecord_s *)((long)&psVar3->previous + 1);
        lVar1 = lVar1 + 8;
      } while (psVar3 < record[5].previous);
    }
    lVar1 = 0;
    do {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)((long)&record[6].previous + lVar1));
      lVar1 = lVar1 + 8;
    } while (lVar1 != 0x200);
    lVar1 = 0x260;
    goto switchD_00137311_caseD_4;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 2));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[2].type);
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 3));
    if (*(long *)&record[3].type != 0) {
      lVar1 = 0;
      uVar4 = 0;
      do {
        (*iterationFunction)
                  (userdata,(sysbvm_tuple_t *)((long)&(record[4].previous)->previous + lVar1));
        uVar4 = uVar4 + 1;
        lVar1 = lVar1 + 8;
      } while (uVar4 < *(ulong *)&record[3].type);
    }
    if (*(long *)&record[4].type != 0) {
      psVar6 = record + 5;
      uVar4 = 0;
      do {
        (*iterationFunction)(userdata,(sysbvm_tuple_t *)psVar6);
        uVar4 = uVar4 + 1;
        psVar6 = (sysbvm_stackFrameRecord_t *)&psVar6->type;
      } while (uVar4 < *(ulong *)&record[4].type);
    }
    if (record[0xd].previous != (sysbvm_stackFrameRecord_s *)0x0) {
      psVar7 = &record[0xd].type;
      psVar3 = (sysbvm_stackFrameRecord_s *)0x0;
      do {
        (*iterationFunction)(userdata,(sysbvm_tuple_t *)psVar7);
        psVar3 = (sysbvm_stackFrameRecord_s *)((long)&psVar3->previous + 1);
        psVar7 = psVar7 + 2;
      } while (psVar3 < record[0xd].previous);
    }
    return;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET:
  case SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET:
  case SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION:
  case SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP:
    goto switchD_00137311_caseD_4;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 1));
    lVar8 = 0x28;
    lVar5 = 0x20;
    lVar2 = 0x18;
    lVar1 = 0x30;
    break;
  default:
    abort();
  }
  (*iterationFunction)(userdata,(sysbvm_tuple_t *)((long)&record->previous + lVar2));
  (*iterationFunction)(userdata,(sysbvm_tuple_t *)((long)&record->previous + lVar5));
  (*iterationFunction)(userdata,(sysbvm_tuple_t *)((long)&record->previous + lVar8));
switchD_00137311_caseD_4:
  (*iterationFunction)(userdata,(sysbvm_tuple_t *)((long)&record->previous + lVar1));
  return;
}

Assistant:

SYSBVM_API void sysbvm_stackFrame_iterateGCRootsInRecordWith(sysbvm_stackFrameRecord_t *record, void *userdata, sysbvm_GCRootIterationFunction_t iterationFunction)
{
    switch(record->type)
    {
    case SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS:
        {
            sysbvm_stackFrameGCRootsRecord_t *rootRecord = (sysbvm_stackFrameGCRootsRecord_t*)record;
            for(size_t i = 0; i < rootRecord->rootCount; ++i)
                iterationFunction(userdata, &rootRecord->roots[i]);
        }
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION:
        {
            sysbvm_stackFrameFunctionActivationRecord_t *functionRecord = (sysbvm_stackFrameFunctionActivationRecord_t*)record;
            iterationFunction(userdata, &functionRecord->function);
            iterationFunction(userdata, &functionRecord->functionDefinition);
            iterationFunction(userdata, &functionRecord->applicationEnvironment);
            iterationFunction(userdata, &functionRecord->result);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION:
        {
            sysbvm_stackFrameBytecodeFunctionActivationRecord_t *functionRecord = (sysbvm_stackFrameBytecodeFunctionActivationRecord_t*)record;
            iterationFunction(userdata, &functionRecord->function);
            iterationFunction(userdata, &functionRecord->functionDefinition);
            iterationFunction(userdata, &functionRecord->functionBytecode);

            iterationFunction(userdata, &functionRecord->captureVector);
            iterationFunction(userdata, &functionRecord->literalVector);
            iterationFunction(userdata, &functionRecord->instructions);

            for(size_t i = 0; i < functionRecord->argumentCount; ++i)
                iterationFunction(userdata, functionRecord->arguments + i);

            for(size_t i = 0; i < functionRecord->inlineLocalVectorSize; ++i)
                iterationFunction(userdata, functionRecord->inlineLocalVector + i);

            for(size_t i = 0; i < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE; ++i)
                iterationFunction(userdata, functionRecord->operandRegisterFile + i);

            iterationFunction(userdata, &functionRecord->result);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION:
        {
            sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t *functionRecord = (sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t*)record;

            iterationFunction(userdata, &functionRecord->literalVector);
            iterationFunction(userdata, &functionRecord->captureVector);
            iterationFunction(userdata, &functionRecord->function);

            for(size_t i = 0; i < functionRecord->argumentCount; ++i)
                iterationFunction(userdata, functionRecord->arguments + i);

            for(size_t i = 0; i < functionRecord->callArgumentVectorSize; ++i)
                iterationFunction(userdata, functionRecord->callArgumentVector + i);

            for(size_t i = 0; i < functionRecord->inlineLocalVectorSize; ++i)
                iterationFunction(userdata, functionRecord->inlineLocalVector + i);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET:
        {
            sysbvm_stackFrameBreakTargetRecord_t *breakRecord = (sysbvm_stackFrameBreakTargetRecord_t*)record;
            iterationFunction(userdata, &breakRecord->environment);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET:
        {
            sysbvm_stackFrameContinueTargetRecord_t *continueRecord = (sysbvm_stackFrameContinueTargetRecord_t*)record;
            iterationFunction(userdata, &continueRecord->environment);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION:
        {
            sysbvm_stackFrameSourcePositionRecord_t *sourcePositionRecord = (sysbvm_stackFrameSourcePositionRecord_t*)record;
            iterationFunction(userdata, &sourcePositionRecord->sourcePosition);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD:
        {
            sysbvm_stackFrameLandingPadRecord_t *landingPadRecord = (sysbvm_stackFrameLandingPadRecord_t*)record;
            iterationFunction(userdata, &landingPadRecord->exceptionFilter);
            iterationFunction(userdata, &landingPadRecord->stackTrace);
            iterationFunction(userdata, &landingPadRecord->exception);
            iterationFunction(userdata, &landingPadRecord->action);
            iterationFunction(userdata, &landingPadRecord->actionResult);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP:
        {
            sysbvm_stackFrameCleanupRecord_t *cleanupRecord = (sysbvm_stackFrameCleanupRecord_t*)record;
            iterationFunction(userdata, &cleanupRecord->action);
        }   
        break;
    default:
        // Should not reach here.
        abort();
        break;
    }
}